

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_colorf nk_hsva_colorf(float h,float s,float v,float a)

{
  nk_colorf nVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float f;
  float t;
  float q;
  float p;
  int i;
  float a_local;
  float v_local;
  float s_local;
  float h_local;
  nk_colorf out;
  
  memset(&s_local,0,0x10);
  s_local = v;
  h_local = v;
  out.r = v;
  if (0.0 < s) {
    iVar2 = (int)(h / 0.16666667);
    fVar3 = h / 0.16666667 - (float)iVar2;
    out.r = v * (1.0 - s);
    fVar4 = v * (1.0 - s * fVar3);
    fVar3 = v * (1.0 - s * (1.0 - fVar3));
    s_local = v;
    h_local = fVar3;
    switch(iVar2) {
    case 0:
      break;
    case 1:
      s_local = fVar4;
      h_local = v;
      break;
    case 2:
      s_local = out.r;
      h_local = v;
      out.r = fVar3;
      break;
    case 3:
      s_local = out.r;
      h_local = fVar4;
      out.r = v;
      break;
    case 4:
      s_local = fVar3;
      h_local = out.r;
      out.r = v;
      break;
    case 5:
      s_local = v;
      h_local = out.r;
      out.r = fVar4;
    }
  }
  nVar1.g = h_local;
  nVar1.r = s_local;
  nVar1.b = out.r;
  nVar1.a = a;
  return nVar1;
}

Assistant:

NK_API struct nk_colorf
nk_hsva_colorf(float h, float s, float v, float a)
{
    int i;
    float p, q, t, f;
    struct nk_colorf out = {0,0,0,0};
    if (s <= 0.0f) {
        out.r = v; out.g = v; out.b = v; out.a = a;
        return out;
    }
    h = h / (60.0f/360.0f);
    i = (int)h;
    f = h - (float)i;
    p = v * (1.0f - s);
    q = v * (1.0f - (s * f));
    t = v * (1.0f - s * (1.0f - f));

    switch (i) {
    case 0: default: out.r = v; out.g = t; out.b = p; break;
    case 1: out.r = q; out.g = v; out.b = p; break;
    case 2: out.r = p; out.g = v; out.b = t; break;
    case 3: out.r = p; out.g = q; out.b = v; break;
    case 4: out.r = t; out.g = p; out.b = v; break;
    case 5: out.r = v; out.g = p; out.b = q; break;}
    out.a = a;
    return out;
}